

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPDUHandler.cpp
# Opt level: O2

bool handleSetRequestPDU(deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
                        deque<VarBind,_std::allocator<VarBind>_> *varbindList,
                        deque<VarBind,_std::allocator<VarBind>_> *outResponseList,
                        SNMP_VERSION snmpVersion)

{
  _Elt_pointer pVVar1;
  SNMP_ERROR_STATUS SVar2;
  SNMP_ERROR_STATUS SVar3;
  ValueCallback *callback;
  _Elt_pointer pVVar4;
  _Elt_pointer __args;
  shared_ptr<BER_CONTAINER> value;
  ERROR_STATUS_WITH_VALUE local_3c;
  _Map_pointer local_38;
  
  __args = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pVVar4 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last;
  local_38 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pVVar1 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  SVar2 = NOT_WRITABLE;
  if (snmpVersion == SNMP_VERSION_1) {
    SVar2 = NO_SUCH_NAME;
  }
  do {
    if (__args == pVVar1) {
      return true;
    }
    callback = ValueCallback::findCallback
                         (callbacks,
                          (__args->oid).super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,false,0,(size_t *)0x0);
    SVar3 = SVar2;
    if ((callback == (ValueCallback *)0x0) ||
       (SVar3 = (uint)(snmpVersion != SNMP_VERSION_1) * 4 + BAD_VALUE,
       callback->type != __args->type)) {
LAB_0010922b:
      value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = SVar3;
      std::deque<VarBind,std::allocator<VarBind>>::
      emplace_back<std::shared_ptr<OIDType>const&,ERROR_STATUS_WITH_VALUE>
                ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&__args->oid,
                 (ERROR_STATUS_WITH_VALUE *)&value);
    }
    else {
      if (callback->isSettable == false) {
        value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = READ_ONLY
        ;
        SVar3 = (SNMP_ERROR_STATUS)
                value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        goto LAB_0010922b;
      }
      SVar3 = ValueCallback::setValueForCallback(callback,&__args->value);
      if (SVar3 == NO_ERROR) {
        ValueCallback::getValueForCallback((ValueCallback *)&value,callback);
        if (CONCAT44(value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                     _4_4_,(SNMP_ERROR_STATUS)
                           value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr) == 0) {
          local_3c = GEN_ERR;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                    ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&callback->OID,
                     &local_3c);
        }
        else {
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,std::shared_ptr<BER_CONTAINER>&>
                    ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&callback->OID,&value
                    );
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      else {
        value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = GEN_ERR;
        if ((int)SVar3 < 5) {
          value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = SVar3;
        }
        if (snmpVersion != SNMP_VERSION_1) {
          value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = SVar3;
        }
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                  ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&callback->OID,
                   (ERROR_STATUS_WITH_VALUE *)&value);
      }
    }
    __args = __args + 1;
    if (__args == pVVar4) {
      __args = local_38[1];
      local_38 = local_38 + 1;
      pVVar4 = __args + 10;
    }
  } while( true );
}

Assistant:

bool handleSetRequestPDU(std::deque<ValueCallback*> &callbacks, std::deque<VarBind> &varbindList, std::deque<VarBind> &outResponseList, SNMP_VERSION snmpVersion){
    SNMP_LOGD("handleSetRequestPDU\n");
    for(const VarBind& requestVarBind : varbindList){
        SNMP_LOGD("finding callback for OID: %s\n", requestVarBind.oid->string().c_str());
        ValueCallback* callback = ValueCallback::findCallback(callbacks, requestVarBind.oid.get(), false);
        if(!callback){
            SNMP_LOGD("Couldn't find callback\n");
            outResponseList.emplace_back(requestVarBind.oid, SNMP_ERROR_VERSION_CTRL_DEF(NOT_WRITABLE, snmpVersion, NO_SUCH_NAME));
            continue;
        }

        SNMP_LOGD("Callback found with OID: %s\n", callback->OID->string().c_str());

        if(callback->type != requestVarBind.type){
            SNMP_LOGD("Callback Type mismatch: %d\n", callback->type);
            outResponseList.emplace_back(requestVarBind.oid, SNMP_ERROR_VERSION_CTRL_DEF(WRONG_TYPE, snmpVersion, BAD_VALUE));
            continue;
        }
        
        if(!callback->isSettable){
            SNMP_LOGD("Cannot set this object\n");
            outResponseList.emplace_back(requestVarBind.oid, SNMP_ERROR_VERSION_CTRL(READ_ONLY, snmpVersion));
            continue;
        }
        //NOTE: we could just use the same pointer as the reqwuest, but delete the value and add a new one. Will have to figure out what to do if it errors, do that later
        SNMP_ERROR_STATUS setError = ValueCallback::setValueForCallback(callback, requestVarBind.value);
        if(setError != NO_ERROR){
            SNMP_LOGD("Attempting to set Variable failed: %d\n", setError);
            outResponseList.emplace_back(callback->OID, SNMP_ERROR_VERSION_CTRL(setError, snmpVersion));
            continue;   
        }

        auto value = ValueCallback::getValueForCallback(callback);

        if(!value){
            SNMP_LOGD("Couldn't get value for callback\n");
            outResponseList.emplace_back(callback->OID, SNMP_ERROR_VERSION_CTRL(GEN_ERR, snmpVersion));
            continue;   
        }

        outResponseList.emplace_back(callback->OID, value);
    }
    return true; // we didn't fail in our job

}